

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

ssize_t __thiscall
kj::anon_unknown_36::HttpFixedLengthEntityWriter::write
          (HttpFixedLengthEntityWriter *this,int __fd,void *__buf,size_t __n)

{
  Coroutine<void> *this_00;
  HttpOutputStream *this_01;
  PromiseAwaiter<void> *__return_storage_ptr__;
  _func_int **pp_Var1;
  PromiseArenaMember *node;
  SourceLocation location;
  bool bVar2;
  coroutine_handle<void> coroutine;
  HttpOutputStream *pHVar3;
  FixVoid<void> *value;
  undefined4 in_register_00000034;
  HttpEntityBodyWriter *this_02;
  ArrayPtr<const_unsigned_char> buffer;
  Fault f;
  DebugComparison<unsigned_long,_unsigned_long_&> _kjCondition;
  Fault local_70;
  DebugComparison<unsigned_long,_unsigned_long_&> local_68;
  void *local_40;
  HttpFixedLengthEntityWriter *local_38;
  
  this_02 = (HttpEntityBodyWriter *)CONCAT44(in_register_00000034,__fd);
  local_40 = __buf;
  coroutine._M_fr_ptr = operator_new(0x408);
  *(code **)coroutine._M_fr_ptr = write;
  *(code **)((long)coroutine._M_fr_ptr + 8) = write;
  this_00 = (Coroutine<void> *)((long)coroutine._M_fr_ptr + 0x10);
  *(HttpEntityBodyWriter **)((long)coroutine._M_fr_ptr + 0x3f8) = this_02;
  local_68.left = 0x50fbd6;
  local_68.right = (unsigned_long *)0x4f16cf;
  local_68.op.content.ptr = (char *)0x11000009a8;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_0062dd10;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_0062dd58;
  location.function = "write";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x9a8;
  location.columnNumber = 0x11;
  kj::_::CoroutineBase::CoroutineBase
            ((CoroutineBase *)this_00,coroutine,
             (ExceptionOrValue *)((long)coroutine._M_fr_ptr + 0x98),location);
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_0062dd10;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_0062dd58;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x98) = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x230) = 0;
  (this->super_HttpEntityBodyWriter).super_AsyncOutputStream._vptr_AsyncOutputStream =
       (_func_int **)this_00;
  local_38 = this;
  if (__n == 0) {
    value = (FixVoid<void> *)((long)coroutine._M_fr_ptr + 0x402);
  }
  else {
    local_68.right = (unsigned_long *)(this_02 + 1);
    pp_Var1 = this_02[1].super_AsyncOutputStream._vptr_AsyncOutputStream;
    local_68.op.content.ptr = " <= ";
    local_68.op.content.size_ = 5;
    local_68.result = pp_Var1 >= __n;
    local_68.left = __n;
    if (pp_Var1 < __n) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long&>&,char_const(&)[25]>
                (&local_70,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x9aa,FAILED,"buffer.size() <= length","_kjCondition,\"overwrote Content-Length\""
                 ,&local_68,(char (*) [25])"overwrote Content-Length");
      kj::_::Debug::Fault::fatal(&local_70);
    }
    this_02[1].super_AsyncOutputStream._vptr_AsyncOutputStream = (_func_int **)((long)pp_Var1 - __n)
    ;
    pHVar3 = HttpEntityBodyWriter::getInner(this_02);
    this_01 = (HttpOutputStream *)((long)coroutine._M_fr_ptr + 0x3f0);
    buffer.size_ = (size_t)local_40;
    buffer.ptr = (uchar *)pHVar3;
    HttpOutputStream::writeBodyData(this_01,buffer);
    __return_storage_ptr__ = (PromiseAwaiter<void> *)((long)coroutine._M_fr_ptr + 0x238);
    co_await<void>(__return_storage_ptr__,(Promise<void> *)this_01);
    *(undefined1 *)((long)coroutine._M_fr_ptr + 0x400) = 0;
    bVar2 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                      ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
    if (bVar2) {
      return (ssize_t)local_38;
    }
    kj::_::PromiseAwaiter<void>::await_resume(__return_storage_ptr__);
    if (*(char *)((long)coroutine._M_fr_ptr + 0x250) == '\x01') {
      Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 600));
    }
    kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)__return_storage_ptr__);
    node = (PromiseArenaMember *)
           (this_01->super_WrappableStreamMixin<kj::(anonymous_namespace)::HttpOutputStream>).
           currentWrapper.ptr;
    if (node != (PromiseArenaMember *)0x0) {
      (this_01->super_WrappableStreamMixin<kj::(anonymous_namespace)::HttpOutputStream>).
      currentWrapper.ptr = (Maybe<kj::(anonymous_namespace)::HttpOutputStream_&> *)0x0;
      kj::_::PromiseDisposer::dispose(node);
    }
    value = (FixVoid<void> *)((long)coroutine._M_fr_ptr + 0x401);
    if ((*(HttpEntityBodyWriter **)((long)coroutine._M_fr_ptr + 0x3f8))[1].super_AsyncOutputStream.
        _vptr_AsyncOutputStream == (_func_int **)0x0) {
      HttpEntityBodyWriter::doneWriting
                (*(HttpEntityBodyWriter **)((long)coroutine._M_fr_ptr + 0x3f8));
    }
  }
  kj::_::Coroutine<void>::fulfill(this_00,value);
  *(undefined8 *)coroutine._M_fr_ptr = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x400) = 1;
  return (ssize_t)local_38;
}

Assistant:

Promise<void> write(ArrayPtr<const byte> buffer) override {
    if (buffer == nullptr) co_return;
    KJ_REQUIRE(buffer.size() <= length, "overwrote Content-Length");
    length -= buffer.size();

    co_await getInner().writeBodyData(buffer);
    if (length == 0) doneWriting();
  }